

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O2

void __thiscall Shared_Multi_Field_operators::test_method(Shared_Multi_Field_operators *this)

{
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::initialize(5,0xd);
  test_multi_field_operators<Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>>
            ();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Shared_Multi_Field_operators) {
#ifdef PM_GMP_FOUND
  Shared_multi_field_element::initialize(5, 13);
  test_multi_field_operators<Shared_multi_field_element>();
#endif
  Shared_multi_field_element_with_small_characteristics<>::initialize(5, 13);
  test_multi_field_operators<Shared_multi_field_element_with_small_characteristics<> >();
}